

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_cond.cpp
# Opt level: O1

void __thiscall SharedCond::SharedCond(SharedCond *this)

{
  int iVar1;
  __pid_t _Var2;
  SharedMemoryObject<pthread_cond_t> *this_00;
  ContextManager *pCVar3;
  pointer __p;
  pthread_condattr_t condattr;
  pthread_condattr_t local_3c;
  string local_38;
  
  (this->cond_)._M_t.
  super___uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<pthread_cond_t>_*,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<pthread_cond_t>_*,_false>._M_head_impl =
       (SharedMemoryObject<pthread_cond_t> *)0x0;
  this_00 = (SharedMemoryObject<pthread_cond_t> *)operator_new(8);
  SharedMemoryObject<pthread_cond_t>::SharedMemoryObject<>(this_00);
  local_38._M_dataplus._M_p = (pointer)0x0;
  std::
  __uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
           *)this,this_00);
  std::
  unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
                 *)&local_38);
  iVar1 = pthread_condattr_init(&local_3c);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Failed to initialize condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = pthread_condattr_setpshared(&local_3c,1);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Failed to set PTHREAD_PROCESS_SHARED to condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = pthread_cond_init((pthread_cond_t *)
                            ((this->cond_)._M_t.
                             super___uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SharedMemoryObject<pthread_cond_t>_*,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
                             .super__Head_base<0UL,_SharedMemoryObject<pthread_cond_t>_*,_false>.
                            _M_head_impl)->ptr_,&local_3c);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Failed to initialize cond: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = pthread_condattr_destroy(&local_3c);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Failed to destroy condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  _Var2 = getpid();
  this->owner_pid_ = _Var2;
  return;
}

Assistant:

SharedCond::SharedCond() {
    cond_ = std::make_unique<SharedMemoryObject<pthread_cond_t>>();
    pthread_condattr_t condattr;
    if (pthread_condattr_init(&condattr) != 0) {
        die(format("Failed to initialize condattr: %m"));
    }
    if (pthread_condattr_setpshared(&condattr, PTHREAD_PROCESS_SHARED) != 0) {
        die(format("Failed to set PTHREAD_PROCESS_SHARED to condattr: %m"));
    }
    if (pthread_cond_init(cond_->get(), &condattr)) {
        die(format("Failed to initialize cond: %m"));
    }
    if (pthread_condattr_destroy(&condattr) != 0) {
        die(format("Failed to destroy condattr: %m"));
    }
    owner_pid_ = getpid();
}